

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots.h
# Opt level: O0

void __thiscall bandit::reporter::dots::it_unknown_error(dots *this,string *desc)

{
  ostream *poVar1;
  string local_68 [48];
  string local_38 [32];
  string *local_18;
  string *desc_local;
  dots *this_local;
  
  local_18 = desc;
  desc_local = (string *)this;
  progress_base::it_unknown_error((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])();
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"E");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_68);
  std::operator<<(poVar1,local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  std::ostream::flush();
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        progress_base::it_unknown_error(desc);
        stm_ << colorizer_.bad() << "E" << colorizer_.reset();
        stm_.flush();
      }